

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O3

void cs_debugger_step_callback(statement_base *stmt)

{
  size_t __n;
  ulong line_num;
  bool bVar1;
  int iVar2;
  string *psVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>::iterator,_bool>
  local_40;
  
  psVar3 = cs::statement_base::get_file_path_abi_cxx11_(stmt);
  __n = psVar3->_M_string_length;
  if ((__n == path_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((psVar3->_M_dataplus)._M_p,path_abi_cxx11_._M_dataplus._M_p,__n), iVar2 == 0))))
  {
    sVar4 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
            ::count<std::__cxx11::string>
                      ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
                        *)&(((context.
                              super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->compiler).
                            super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->csyms,&path_abi_cxx11_);
    if (sVar4 == 0) {
      if ((exec_by_step == false) &&
         (bVar1 = breakpoint_recorder::exist(&breakpoints,stmt->line_num), bVar1)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nHit breakpoint, at \"",0x15);
        psVar3 = cs::statement_base::get_file_path_abi_cxx11_(stmt);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(psVar3->_M_dataplus)._M_p,
                            psVar3->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\", line ",8);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        current_level =
             *(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3;
        exec_by_step = true;
      }
      else if ((exec_by_step & 1U) == 0) {
        return;
      }
      if ((step_into_function != false) ||
         ((ulong)(*(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3
                 ) <= current_level)) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
        psVar3 = cs::statement_base::get_raw_code_abi_cxx11_(stmt);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        current_level =
             *(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3;
        step_into_function = false;
        do {
          bVar1 = covscript_debugger();
        } while (bVar1);
      }
    }
    else {
      phmap::priv::
      raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
      ::try_emplace_impl<std::__cxx11::string_const&>
                (&local_40,
                 &(((context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->csyms,&path_abi_cxx11_);
      if (((stmt->line_num <
            (ulong)(*(long *)((long)local_40.first.field_1.slot_ + 0x48) -
                    *(long *)((long)local_40.first.field_1.slot_ + 0x40) >> 3)) &&
          (line_num = *(ulong *)(*(long *)((long)local_40.first.field_1.slot_ + 0x40) + -8 +
                                stmt->line_num * 8), line_num != 0)) &&
         (lVar6 = *(long *)((long)local_40.first.field_1.slot_ + 0x58),
         line_num < (ulong)(*(long *)((long)local_40.first.field_1.slot_ + 0x60) - lVar6 >> 5))) {
        if ((exec_by_step == false) &&
           (bVar1 = breakpoint_recorder::exist(&breakpoints,line_num), bVar1)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nHit breakpoint, at \"",0x15);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,
                              *(char **)((long)local_40.first.field_1.slot_ + 0x20),
                              *(long *)((long)local_40.first.field_1.slot_ + 0x28));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\", line ",8);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::endl<char,std::char_traits<char>>(poVar5);
          current_level =
               *(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3;
          exec_by_step = true;
        }
        else if ((exec_by_step & 1U) == 0) {
          return;
        }
        if ((step_into_function != false) ||
           ((ulong)(*(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >>
                   3) <= current_level)) {
          lVar6 = lVar6 + line_num * 0x20;
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,*(char **)(lVar6 + -0x20),*(long *)(lVar6 + -0x18));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          current_level =
               *(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3;
          step_into_function = false;
          do {
            bVar1 = covscript_debugger();
          } while (bVar1);
        }
      }
    }
  }
  return;
}

Assistant:

void cs_debugger_step_callback(cs::statement_base *stmt)
{
	if (stmt->get_file_path() != path)
		return;
	if (context->compiler->csyms.count(path) > 0) {
		cs::csym_info &csym = context->compiler->csyms[path];
		std::size_t current_line = stmt->get_line_num();
		if (current_line >= csym.map.size())
			return;
		std::size_t actual_line = csym.map[current_line - 1];
		if (actual_line >= csym.codes.size() || actual_line == 0)
			return;
		const std::string &code = csym.codes[actual_line - 1];
		if (!exec_by_step && breakpoints.exist(actual_line)) {
			std::cout << "\nHit breakpoint, at \"" << csym.file << "\", line " << actual_line
			          << std::endl;
			current_level = cs::current_process->stack.size();
			exec_by_step = true;
		}
		if (exec_by_step && (step_into_function || cs::current_process->stack.size() <= current_level)) {
			std::cout << actual_line << "\t" << code << std::endl;
			current_level = cs::current_process->stack.size();
			step_into_function = false;
			while (covscript_debugger());
		}
	}
	else {
		if (!exec_by_step && breakpoints.exist(stmt->get_line_num())) {
			std::cout << "\nHit breakpoint, at \"" << stmt->get_file_path() << "\", line " << stmt->get_line_num()
			          << std::endl;
			current_level = cs::current_process->stack.size();
			exec_by_step = true;
		}
		if (exec_by_step && (step_into_function || cs::current_process->stack.size() <= current_level)) {
			std::cout << stmt->get_line_num() << "\t" << stmt->get_raw_code() << std::endl;
			current_level = cs::current_process->stack.size();
			step_into_function = false;
			while (covscript_debugger());
		}
	}
}